

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FiniteModelMultiSorted.hpp
# Opt level: O3

pair<unsigned_int,_unsigned_int> __thiscall
FMB::FiniteModelMultiSorted::getDomainConstant(FiniteModelMultiSorted *this,Term *t)

{
  Entry *pEVar1;
  undefined8 *puVar2;
  long *plVar3;
  long *plVar4;
  Term *local_88;
  string local_80;
  long *local_60;
  long local_58;
  long local_50;
  undefined4 uStack_48;
  undefined4 uStack_44;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  local_88 = t;
  pEVar1 = Lib::
           DHMap<Kernel::Term_*,_std::pair<unsigned_int,_unsigned_int>,_Lib::DefaultHash,_Lib::DefaultHash2>
           ::findEntry(&this->_domainConstantsRev,&local_88);
  if (pEVar1 != (Entry *)0x0) {
    return pEVar1->_val;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(0x50);
  Kernel::Term::toString_abi_cxx11_(&local_80,local_88,true);
  std::operator+(&local_40,"Evaluated to ",&local_80);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_40);
  local_60 = (long *)*plVar3;
  plVar4 = plVar3 + 2;
  if (local_60 == plVar4) {
    local_50 = *plVar4;
    uStack_48 = (undefined4)plVar3[3];
    uStack_44 = *(undefined4 *)((long)plVar3 + 0x1c);
    local_60 = &local_50;
  }
  else {
    local_50 = *plVar4;
  }
  local_58 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  *puVar2 = &PTR_cry_00b3dfc0;
  puVar2[1] = puVar2 + 3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(puVar2 + 1),local_60,local_58 + (long)local_60);
  *puVar2 = &PTR_cry_00b3e0a8;
  *(undefined4 *)(puVar2 + 5) = 0;
  puVar2[6] = puVar2 + 8;
  puVar2[7] = 0;
  *(undefined1 *)(puVar2 + 8) = 0;
  __cxa_throw(puVar2,&Lib::UserErrorException::typeinfo,Lib::UserErrorException::~UserErrorException
             );
}

Assistant:

std::pair<unsigned,unsigned> getDomainConstant(Term* t)
  {
    std::pair<unsigned,unsigned> pair;
    if(_domainConstantsRev.find(t,pair)) return pair;
    USER_ERROR("Evaluated to "+t->toString()+" when expected a domain constant, probably a partial model");
  }